

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O3

void __thiscall
bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::reserve
          (pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_> *this,size_type n)

{
  pointer ppCVar1;
  Constraint **__dest;
  
  if ((this->ebo_).cap < n) {
    __dest = __gnu_cxx::new_allocator<Clasp::Constraint_*>::allocate
                       ((new_allocator<Clasp::Constraint_*> *)this,(ulong)n,(void *)0x0);
    ppCVar1 = (this->ebo_).buf;
    if (ppCVar1 != (pointer)0x0) {
      memcpy(__dest,ppCVar1,(ulong)(this->ebo_).size << 3);
      ppCVar1 = (this->ebo_).buf;
      if (ppCVar1 != (pointer)0x0) {
        operator_delete(ppCVar1);
      }
    }
    (this->ebo_).buf = __dest;
    (this->ebo_).cap = n;
  }
  return;
}

Assistant:

void reserve(size_type n) {
		if (n > capacity()) {
			T* temp = ebo_.allocate(n);
			if (ebo_.buf) {
				std::memcpy(temp, ebo_.buf, size()*sizeof(T));
			}
			ebo_.release();
			ebo_.buf = temp;
			ebo_.cap = n;
		}
	}